

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sasl_plain.c
# Opt level: O1

void saslplain_destroy(CONCRETE_SASL_MECHANISM_HANDLE sasl_mechanism_concrete_handle)

{
  LOGGER_LOG UNRECOVERED_JUMPTABLE;
  
  if (sasl_mechanism_concrete_handle != (CONCRETE_SASL_MECHANISM_HANDLE)0x0) {
    if (*sasl_mechanism_concrete_handle != (void *)0x0) {
      free(*sasl_mechanism_concrete_handle);
    }
    free(sasl_mechanism_concrete_handle);
    return;
  }
  UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
  if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
    (*UNRECOVERED_JUMPTABLE)
              (AZ_LOG_ERROR,
               "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/sasl_plain.c"
               ,"saslplain_destroy",0x83,1,"NULL sasl_mechanism_concrete_handle");
    return;
  }
  return;
}

Assistant:

void saslplain_destroy(CONCRETE_SASL_MECHANISM_HANDLE sasl_mechanism_concrete_handle)
{
    if (sasl_mechanism_concrete_handle == NULL)
    {
        /* Codes_SRS_SASL_PLAIN_01_006: [If the argument `concrete_sasl_mechanism` is NULL, `saslplain_destroy` shall do nothing.] */
        LogError("NULL sasl_mechanism_concrete_handle");
    }
    else
    {
        /* Codes_SRS_SASL_PLAIN_01_005: [`saslplain_destroy` shall free all resources associated with the SASL mechanism.] */
        SASL_PLAIN_INSTANCE* sasl_plain_instance = (SASL_PLAIN_INSTANCE*)sasl_mechanism_concrete_handle;
        if (sasl_plain_instance->init_bytes != NULL)
        {
            free(sasl_plain_instance->init_bytes);
        }

        free(sasl_plain_instance);
    }
}